

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_fd.c
# Opt level: O0

int archive_write_open_fd(archive *a,int fd)

{
  int *client_data;
  write_fd_data *mine;
  int fd_local;
  archive *a_local;
  
  client_data = (int *)malloc(4);
  if (client_data == (int *)0x0) {
    archive_set_error(a,0xc,"No memory");
    a_local._4_4_ = -0x1e;
  }
  else {
    *client_data = fd;
    a_local._4_4_ =
         archive_write_open2(a,client_data,file_open,file_write,(undefined1 *)0x0,file_free);
  }
  return a_local._4_4_;
}

Assistant:

int
archive_write_open_fd(struct archive *a, int fd)
{
	struct write_fd_data *mine;

	mine = malloc(sizeof(*mine));
	if (mine == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	mine->fd = fd;
#if defined(__CYGWIN__) || defined(_WIN32)
	setmode(mine->fd, O_BINARY);
#endif
	return (archive_write_open2(a, mine,
		    file_open, file_write, NULL, file_free));
}